

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessor::tryAddCardsOnAnyTableauPile
          (EventsProcessor *this,MouseLeftButtonUpEventData *eventData)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  undefined4 extraout_var;
  ulong uVar5;
  PileId local_30;
  PileId local_2c;
  long *local_28;
  TableauPileCollider *collider;
  MouseLeftButtonUpEventData *pMStack_18;
  PileId id;
  MouseLeftButtonUpEventData *eventData_local;
  EventsProcessor *this_local;
  
  collider._0_4_ = 0;
  pMStack_18 = eventData;
  piles::PileId::PileId((PileId *)((long)&collider + 4),(uint *)&collider);
  do {
    puVar4 = piles::PileId::operator_cast_to_unsigned_int_((PileId *)((long)&collider + 4));
    if (6 < *puVar4) {
      return;
    }
    pCVar1 = this->context;
    piles::PileId::PileId(&local_2c,(PileId *)((long)&collider + 4));
    iVar3 = (*pCVar1->_vptr_Context[8])(pCVar1,&local_2c);
    local_28 = (long *)CONCAT44(extraout_var,iVar3);
    uVar5 = (**(code **)(*local_28 + 0x18))(local_28,&pMStack_18->cardsInHandPosition);
    if ((uVar5 & 1) != 0) {
      piles::PileId::PileId(&local_30,(PileId *)((long)&collider + 4));
      bVar2 = tryAddCardOnTableauPileAndCheckIfHandEmpty(this,&local_30,pMStack_18);
      if (bVar2) {
        return;
      }
    }
    puVar4 = piles::PileId::operator_cast_to_unsigned_int_((PileId *)((long)&collider + 4));
    *puVar4 = *puVar4 + 1;
  } while( true );
}

Assistant:

void EventsProcessor::tryAddCardsOnAnyTableauPile(
    const MouseLeftButtonUpEventData& eventData) const
{
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id) {
        const auto& collider = context.getTableauPileCollider(id);
        if (collider.collidesWithCardsInHand(eventData.cardsInHandPosition) and
            tryAddCardOnTableauPileAndCheckIfHandEmpty(id, eventData))
            return;
    }
}